

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void llvm::detail::anon_unknown_5::AdjustToPrecision
               (SmallVectorImpl<char> *buffer,int *exp,uint FormatPrecision)

{
  long lVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  const_iterator pcVar7;
  SmallVectorImpl<char> *pSVar8;
  SmallVectorImpl<char> *pSVar9;
  bool bVar10;
  char local_e9;
  uint local_e8;
  uint local_e4;
  uint I;
  uint FirstSignificant;
  uint N;
  uint FormatPrecision_local;
  int *exp_local;
  SmallVectorImpl<char> *buffer_local;
  int *local_c0;
  long local_b8;
  int *local_b0;
  ulong local_a8;
  int *local_a0;
  ulong local_98;
  int *local_90;
  ulong local_88;
  int *local_80;
  long local_78;
  int *local_70;
  ulong local_68;
  int *local_60;
  ulong local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  
  FirstSignificant = FormatPrecision;
  _N = exp;
  exp_local = (int *)buffer;
  sVar5 = SmallVectorBase::size((SmallVectorBase *)buffer);
  local_48 = exp_local;
  I = (uint)sVar5;
  if (FirstSignificant < I) {
    local_e4 = I - FirstSignificant;
    uVar4 = local_e4 - 1;
    local_50 = exp_local;
    local_58 = (ulong)uVar4;
    sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
    if (sVar5 <= uVar4) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                   );
    }
    if (*(char *)(*(long *)local_48 + local_58) < '5') {
      while( true ) {
        piVar2 = exp_local;
        bVar10 = false;
        if (local_e4 < I) {
          uVar6 = (ulong)local_e4;
          local_60 = exp_local;
          local_68 = uVar6;
          sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
          if (sVar5 <= uVar6) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          local_40 = piVar2;
          bVar10 = *(char *)(*(long *)piVar2 + local_68) == '0';
        }
        piVar2 = exp_local;
        if (!bVar10) break;
        local_e4 = local_e4 + 1;
      }
      *_N = local_e4 + *_N;
      local_70 = exp_local;
      local_78 = 0;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
      piVar3 = exp_local;
      if (sVar5 == 0) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      local_38 = piVar2;
      pcVar7 = (const_iterator)(*(long *)piVar2 + local_78);
      uVar6 = (ulong)local_e4;
      local_80 = exp_local;
      local_88 = uVar6;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
      if (sVar5 <= uVar6) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      local_30 = piVar3;
      SmallVectorImpl<char>::erase
                ((SmallVectorImpl<char> *)piVar2,pcVar7,(const_iterator)(*(long *)piVar3 + local_88)
                );
    }
    else {
      for (local_e8 = local_e4; piVar2 = exp_local, local_e8 != I; local_e8 = local_e8 + 1) {
        uVar6 = (ulong)local_e8;
        local_90 = exp_local;
        local_98 = uVar6;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
        piVar3 = exp_local;
        if (sVar5 <= uVar6) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        local_28 = piVar2;
        if (*(char *)(*(long *)piVar2 + local_98) != '9') {
          uVar6 = (ulong)local_e8;
          local_a0 = exp_local;
          local_a8 = uVar6;
          sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
          if (sVar5 <= uVar6) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          local_20 = piVar3;
          lVar1 = *(long *)piVar3;
          *(char *)(lVar1 + local_a8) = *(char *)(lVar1 + local_a8) + '\x01';
          break;
        }
        local_e4 = local_e4 + 1;
      }
      piVar2 = exp_local;
      if (local_e4 == I) {
        *_N = local_e4 + *_N;
        SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)exp_local);
        local_e9 = '1';
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)exp_local,&local_e9);
      }
      else {
        *_N = local_e4 + *_N;
        local_b0 = exp_local;
        local_b8 = 0;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)exp_local);
        piVar3 = exp_local;
        if (sVar5 == 0) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        local_18 = piVar2;
        pcVar7 = (const_iterator)(*(long *)piVar2 + local_b8);
        pSVar8 = (SmallVectorImpl<char> *)(ulong)local_e4;
        local_c0 = exp_local;
        buffer_local = pSVar8;
        pSVar9 = (SmallVectorImpl<char> *)SmallVectorBase::size((SmallVectorBase *)exp_local);
        if (pSVar9 <= pSVar8) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        local_10 = piVar3;
        SmallVectorImpl<char>::erase
                  ((SmallVectorImpl<char> *)piVar2,pcVar7,
                   (const_iterator)
                   ((long)&(buffer_local->super_SmallVectorTemplateBase<char,_true>).
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                   + *(long *)piVar3));
      }
    }
  }
  return;
}

Assistant:

void AdjustToPrecision(SmallVectorImpl<char> &buffer,
                         int &exp, unsigned FormatPrecision) {
    unsigned N = buffer.size();
    if (N <= FormatPrecision) return;

    // The most significant figures are the last ones in the buffer.
    unsigned FirstSignificant = N - FormatPrecision;

    // Round.
    // FIXME: this probably shouldn't use 'round half up'.

    // Rounding down is just a truncation, except we also want to drop
    // trailing zeros from the new result.
    if (buffer[FirstSignificant - 1] < '5') {
      while (FirstSignificant < N && buffer[FirstSignificant] == '0')
        FirstSignificant++;

      exp += FirstSignificant;
      buffer.erase(&buffer[0], &buffer[FirstSignificant]);
      return;
    }

    // Rounding up requires a decimal add-with-carry.  If we continue
    // the carry, the newly-introduced zeros will just be truncated.
    for (unsigned I = FirstSignificant; I != N; ++I) {
      if (buffer[I] == '9') {
        FirstSignificant++;
      } else {
        buffer[I]++;
        break;
      }
    }

    // If we carried through, we have exactly one digit of precision.
    if (FirstSignificant == N) {
      exp += FirstSignificant;
      buffer.clear();
      buffer.push_back('1');
      return;
    }

    exp += FirstSignificant;
    buffer.erase(&buffer[0], &buffer[FirstSignificant]);
  }